

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O1

int CfdComputeSchnorrSigPoint(void *handle,char *msg,char *nonce,char *pubkey,char **sigpoint)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  Pubkey sig_point;
  allocator local_f3;
  allocator local_f2;
  allocator local_f1;
  undefined1 local_f0 [32];
  SchnorrPubkey local_d0;
  SchnorrPubkey local_b8;
  ByteData256 local_a0;
  Pubkey local_88;
  string local_70;
  string local_50;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(msg);
  if (bVar1) {
    local_f0._0_8_ = "cfdcapi_key.cpp";
    local_f0._8_4_ = 0x308;
    local_f0._16_8_ = "CfdComputeSchnorrSigPoint";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_f0,kCfdLogLevelWarning,"msg is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Failed to parameter. msg is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(nonce);
  if (bVar1) {
    local_f0._0_8_ = "cfdcapi_key.cpp";
    local_f0._8_4_ = 0x30e;
    local_f0._16_8_ = "CfdComputeSchnorrSigPoint";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_f0,kCfdLogLevelWarning,"nonce is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Failed to parameter. nonce is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (bVar1) {
    local_f0._0_8_ = "cfdcapi_key.cpp";
    local_f0._8_4_ = 0x314;
    local_f0._16_8_ = "CfdComputeSchnorrSigPoint";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_f0,kCfdLogLevelWarning,"pubkey is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Failed to parameter. pubkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (sigpoint != (char **)0x0) {
    std::__cxx11::string::string((string *)local_f0,msg,&local_f1);
    cfd::core::ByteData256::ByteData256(&local_a0,(string *)local_f0);
    std::__cxx11::string::string((string *)&local_50,nonce,&local_f2);
    cfd::core::SchnorrPubkey::SchnorrPubkey(&local_b8,&local_50);
    std::__cxx11::string::string((string *)&local_70,pubkey,&local_f3);
    cfd::core::SchnorrPubkey::SchnorrPubkey(&local_d0,&local_70);
    cfd::core::SchnorrUtil::ComputeSigPoint(&local_88,&local_a0,&local_b8,&local_d0);
    if (local_d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_);
    }
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_f0,&local_88);
    pcVar2 = cfd::capi::CreateString((string *)local_f0);
    *sigpoint = pcVar2;
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_);
    }
    if (local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_f0._0_8_ = "cfdcapi_key.cpp";
  local_f0._8_4_ = 0x31a;
  local_f0._16_8_ = "CfdComputeSchnorrSigPoint";
  cfd::core::logger::log<>((CfdSourceLocation *)local_f0,kCfdLogLevelWarning,"sigpoint is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_f0._0_8_ = local_f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"Failed to parameter. sigpoint is null.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f0);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdComputeSchnorrSigPoint(
    void* handle, const char* msg, const char* nonce, const char* pubkey,
    char** sigpoint) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(nonce)) {
      warn(CFD_LOG_SOURCE, "nonce is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. nonce is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (sigpoint == nullptr) {
      warn(CFD_LOG_SOURCE, "sigpoint is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sigpoint is null.");
    }

    Pubkey sig_point = SchnorrUtil::ComputeSigPoint(
        ByteData256(msg), SchnorrPubkey(nonce), SchnorrPubkey(pubkey));

    *sigpoint = CreateString(sig_point.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}